

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O0

void mtbdd_unmark_rec(MTBDD mtbdd)

{
  int iVar1;
  mtbddnode_t n_00;
  uint64_t uVar2;
  mtbddnode_t n;
  MTBDD mtbdd_local;
  
  n_00 = MTBDD_GETNODE(mtbdd);
  iVar1 = mtbddnode_getmark(n_00);
  if (iVar1 != 0) {
    mtbddnode_setmark(n_00,0);
    iVar1 = mtbddnode_isleaf(n_00);
    if (iVar1 == 0) {
      uVar2 = mtbddnode_getlow(n_00);
      mtbdd_unmark_rec(uVar2);
      uVar2 = mtbddnode_gethigh(n_00);
      mtbdd_unmark_rec(uVar2);
    }
  }
  return;
}

Assistant:

static void
mtbdd_unmark_rec(MTBDD mtbdd)
{
    mtbddnode_t n = MTBDD_GETNODE(mtbdd);
    if (!mtbddnode_getmark(n)) return;
    mtbddnode_setmark(n, 0);
    if (mtbddnode_isleaf(n)) return;
    mtbdd_unmark_rec(mtbddnode_getlow(n));
    mtbdd_unmark_rec(mtbddnode_gethigh(n));
}